

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O2

obj_property * lookup_obj_property_name(char *prop_name)

{
  ushort uVar1;
  obj_property *poVar2;
  int iVar3;
  ulong uVar4;
  obj_property *poVar5;
  
  uVar1 = z_info->property_max;
  uVar4 = 0;
  poVar5 = obj_properties;
  do {
    uVar4 = uVar4 + 1;
    if (uVar1 <= uVar4) {
      return (obj_property *)0x0;
    }
    poVar2 = poVar5 + 1;
    poVar5 = poVar5 + 1;
    iVar3 = strcmp(poVar2->name,prop_name);
  } while (iVar3 != 0);
  return poVar5;
}

Assistant:

struct obj_property *lookup_obj_property_name(const char *prop_name)
{
	struct obj_property *prop;
	int i;

	/* Find the right property */
	for (i = 1; i < z_info->property_max; i++) {
		prop = &obj_properties[i];
		if (streq(prop->name, prop_name)) {
			return prop;
		}
	}

	return NULL;
}